

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void * Timidity::safe_malloc(size_t count)

{
  void *pvVar1;
  void *p;
  size_t count_local;
  
  if (count < "e_tS0_E4GrowEj") {
    pvVar1 = malloc(count);
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
    I_Error("Timidity: Couldn\'t malloc %zu bytes.",count);
  }
  else {
    I_Error("Timidity: Tried allocating %zu bytes. This must be a bug.",count);
  }
  return (void *)0x0;
}

Assistant:

void *safe_malloc(size_t count)
{
	void *p;
	if (count > (1 << 21))
	{
		I_Error("Timidity: Tried allocating %zu bytes. This must be a bug.", count);
	}
	else if ((p = malloc(count)))
	{
		return p;
	}
	else
	{
		I_Error("Timidity: Couldn't malloc %zu bytes.", count);
	}
	return 0;	// Unreachable.
}